

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O2

ostream * operator<<(ostream *os,JSONValue *v)

{
  ostream *poVar1;
  char *pcVar2;
  
  switch(v->type) {
  case None:
    std::operator<<(os,"None");
    break;
  case Number:
    std::operator<<(os,"Number ");
    std::ostream::_M_insert<double>((v->field_1).dvalue);
    break;
  case String:
    poVar1 = std::operator<<(os,"String ");
    std::ostream::_M_insert<void_const*>(poVar1);
    break;
  case Boolean:
    poVar1 = std::operator<<(os,"Boolean ");
    std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    break;
  case List:
    pcVar2 = "List";
    goto LAB_0010ee5d;
  case Object:
    pcVar2 = "Object";
LAB_0010ee5d:
    poVar1 = std::operator<<(os,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const JSONValue& v)
{
    switch (v.type)
    {
    case JSONType::None:
        os << "None";
        break;
    case JSONType::Number:
        os << "Number " << v.dvalue;
        break;
    case JSONType::String:
        os << "String " << v.svalue;
        break;
    case JSONType::Boolean:
        os << "Boolean " << v.bvalue;
        break;
    case JSONType::List:
        os << "List" << std::endl;
        break;
    case JSONType::Object:
        os << "Object" << std::endl;
        break;
    }
    return os;
}